

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.h
# Opt level: O0

uint64_t __thiscall FIX::UInt64Field::getValue(UInt64Field *this)

{
  string *value;
  unsigned_long uVar1;
  FieldConvertError *anon_var_0;
  UInt64Field *this_local;
  
  value = FieldBase::getString_abi_cxx11_(&this->super_FieldBase);
  uVar1 = IntTConvertor<unsigned_long>::convert(value);
  return uVar1;
}

Assistant:

EXCEPT(IncorrectDataFormat) {
    try {
      return UInt64Convertor::convert(getString());
    } catch (FieldConvertError &) {
      throw IncorrectDataFormat(getTag(), getString());
    }
  }